

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  NamedArgumentSyntax *pNVar1;
  PropertyExprSyntax **unaff_retaddr;
  Token *in_stack_00000008;
  Token *in_stack_00000010;
  Token *in_stack_00000018;
  BumpAllocator *in_stack_00000020;
  BumpAllocator *in_stack_000000e8;
  Token *in_stack_000000f0;
  BumpAllocator *in_stack_ffffffffffffff98;
  
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  if (((Token *)((long)__fn + 0x40))->info != (Info *)0x0) {
    deepClone<slang::syntax::PropertyExprSyntax>
              ((PropertyExprSyntax *)__child_stack,in_stack_ffffffffffffff98);
  }
  parsing::Token::deepClone(in_stack_000000f0,in_stack_000000e8);
  pNVar1 = BumpAllocator::
           emplace<slang::syntax::NamedArgumentSyntax,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::PropertyExprSyntax*,slang::parsing::Token>
                     (in_stack_00000020,in_stack_00000018,in_stack_00000010,in_stack_00000008,
                      unaff_retaddr,(Token *)__fn);
  return (int)pNVar1;
}

Assistant:

static SyntaxNode* clone(const NamedArgumentSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<NamedArgumentSyntax>(
        node.dot.deepClone(alloc),
        node.name.deepClone(alloc),
        node.openParen.deepClone(alloc),
        node.expr ? deepClone(*node.expr, alloc) : nullptr,
        node.closeParen.deepClone(alloc)
    );
}